

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O3

int osssb_add_byte(osgen_txtwin_t *win,char c)

{
  uint *puVar1;
  int *piVar2;
  uint uVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar3 = (win->base).flags;
  iVar5 = 0;
  if ((uVar3 & 2) == 0) {
    pcVar4 = win->txtfree;
    pcVar6 = win->txtbuf;
    if (pcVar4 + 1 < win->txtbuf + win->txtbufsiz) {
      pcVar6 = pcVar4 + 1;
    }
    if (((uVar3 & 1) == 0) && (pcVar6 == win->line_ptr[win->first_line])) {
      *pcVar4 = '\0';
      puVar1 = &(win->base).flags;
      *(byte *)puVar1 = (byte)*puVar1 | 2;
      return 0;
    }
    *pcVar4 = c;
    win->txtfree = pcVar6;
    iVar5 = 1;
    if (pcVar6 == win->line_ptr[win->first_line]) {
      uVar8 = win->first_line + 1;
      uVar7 = 0;
      if (uVar8 < win->line_ptr_cnt) {
        uVar7 = uVar8;
      }
      win->first_line = uVar7;
      win->line_count = win->line_count - 1;
      piVar2 = &(win->base).y;
      *piVar2 = *piVar2 + -1;
      iVar5 = (win->base).scrolly;
      if (iVar5 != 0) {
        (win->base).scrolly = iVar5 + -1;
        return 1;
      }
      puVar1 = &(win->base).flags;
      *(byte *)puVar1 = (byte)*puVar1 | 4;
      return 1;
    }
  }
  return iVar5;
}

Assistant:

static int osssb_add_byte(osgen_txtwin_t *win, char c)
{
    char *nxtfree;

    /* if the window is full, indicate failure */
    if ((win->base.flags & OSGEN_FULL) != 0)
        return FALSE;

    /* 
     *   If there's no room, and we're not in auto-vscroll mode, simply
     *   discard the text.  A window that is not in auto-vscroll mode is
     *   designed to always show the oldest text, so if we overflow the
     *   buffer, then we want to start discarding the newest test.  
     */
    nxtfree = ossadvsp(win, win->txtfree);
    if (nxtfree == win->line_ptr[win->first_line]
        && !(win->base.flags & OSGEN_AUTO_VSCROLL))
    {
        /* 
         *   The buffer is full, and we're not in auto-vscroll mode -
         *   discard the new text.  Before we do, set the current last byte
         *   to null, to terminate the current line at this point.  
         */
        *win->txtfree = '\0';

        /* set the 'full' flag */
        win->base.flags |= OSGEN_FULL;

        /* indicate failure */
        return FALSE;
    }

    /* add the character to the buffer */
    *win->txtfree = c;

    /* advance the free pointer */
    win->txtfree = nxtfree;

    /* 
     *   if the free pointer has just collided with the start of the oldest
     *   line, delete the oldest line 
     */
    if (win->txtfree == win->line_ptr[win->first_line])
    {
        /* delete the oldest line to make room for the new data */
        win->first_line++;
        if (win->first_line >= win->line_ptr_cnt)
            win->first_line = 0;

        /* we have one less line in the buffer */
        win->line_count--;

        /* adjust our document cooordinates for the loss of a line */
        win->base.y--;

        /* 
         *   Adjust the scrolling position for the loss of a line.  If the
         *   window is displaying the line that we just deleted (i.e., the
         *   window's vertical scroll offset is zero), we must redraw the
         *   window; otherwise, the change won't affect the display, so we
         *   can merely adjust the scrolling offset.  
         */
        if (win->base.scrolly == 0)
            win->base.flags |= OSGEN_DEFER_REDRAW;
        else
            win->base.scrolly--;
    }

    /* we successfully added the byte */
    return TRUE;
}